

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void format::append_string<std::__cxx11::string,char_const[8],unsigned_long,unsigned_long>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output,
               char (*fmt) [8],unsigned_long *args,unsigned_long *args_1)

{
  char (*index) [8];
  logic_error *plVar1;
  generic_format_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  char local_51;
  char (*pacStack_50) [8];
  char chr;
  char *__end0;
  char *__begin0;
  char (*__range2) [8];
  size_t refNumber;
  unsigned_long *puStack_28;
  bool insideRef;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  char (*fmt_local) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output_local;
  
  refNumber._7_1_ = 0;
  pacStack_50 = fmt + 1;
  __end0 = *fmt;
  __begin0 = *fmt;
  puStack_28 = args_1;
  args_local_1 = args;
  args_local = (unsigned_long *)fmt;
  fmt_local = (char (*) [8])output;
  do {
    index = __range2;
    if (((char (*) [8])__end0 == pacStack_50) || (local_51 = *__end0, local_51 == '\0')) {
      if ((refNumber._7_1_ & 1) == 0) {
        return;
      }
      plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar1,"Last {n} item was not closed");
      __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (local_51 == '{') {
      refNumber._7_1_ = 1;
      __range2 = (char (*) [8])0x0;
    }
    else if (local_51 == '}') {
      if ((char (*) [8])0x1 < __range2) {
        plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar1,"A {n} item in format is out of range");
        __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      format_details::
      generic_format_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::generic_format_value
                (&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt_local);
      format_details::
      variadic_switch<format::format_details::generic_format_value<std::__cxx11::string>,unsigned_long,unsigned_long>
                ((size_t)index,&local_60,args_local_1,puStack_28);
      refNumber._7_1_ = 0;
    }
    else if ((refNumber._7_1_ & 1) == 0) {
      std::__cxx11::string::push_back((char)fmt_local);
    }
    else {
      if ((local_51 < '0') || ('9' < local_51)) {
        plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar1,"Invalid character inside {n} item");
        __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      __range2 = (char (*) [8])((long)(local_51 + -0x30) + (long)__range2 * 10);
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

void append_string(StringType& output,
                     FormatType& fmt,
                     Args&& ... args) {
    bool insideRef = false;
    std::size_t refNumber;

    for (auto chr : fmt) {
      if (!chr)
        break;

      switch (chr) {
        case '{':
          insideRef = true;
          refNumber = 0;
          break;

        case '}':
          if (refNumber < sizeof...(Args)) {
            format_details::variadic_switch(
              refNumber,
              format_details::generic_format_value<StringType>(output),
              std::forward<Args>(args)...);
          }
          else {
            // refNumber is out of range
            throw std::logic_error("A {n} item in format is out of range");
          }
          insideRef = false;
          break;

        default:
          if (insideRef) {
            if (chr >= '0' && chr <= '9') {
              refNumber *= 10;
              refNumber += (chr - '0');
            }
            else
              throw std::logic_error("Invalid character inside {n} item");
          }
          else {
            output.push_back(chr);
          }
          break;
      }
    }

    if (insideRef)
      throw std::logic_error("Last {n} item was not closed");
  }